

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

void __thiscall front::symbolTable::SymbolTable::pop_symbol(SymbolTable *this)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  mapped_type *pmVar5;
  key_type local_40;
  
  psVar1 = (this->symbol_stack).
           super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar2 = psVar1[-1].super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = psVar1[-1].super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  psVar1 = (this->symbol_stack).
           super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->symbol_stack).
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar1 + -1;
  p_Var3 = psVar1[-1].super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar4 = (peVar2->_name)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar4,pcVar4 + (peVar2->_name)._M_string_length);
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->symbol_map,&local_40);
  psVar1 = (pmVar5->
           super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (pmVar5->
  super__Vector_base<std::shared_ptr<front::symbol::Symbol>,_std::allocator<std::shared_ptr<front::symbol::Symbol>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = psVar1 + -1;
  p_Var3 = psVar1[-1].super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void SymbolTable::pop_symbol() {
  SharedSyPtr symbol = symbol_stack.back();
  symbol_stack.pop_back();
  symbol_map[symbol->getName()].pop_back();
}